

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QToolBarAreaLayoutInfo::gapIndex
          (QList<int> *__return_storage_ptr__,QToolBarAreaLayoutInfo *this,QPoint *pos,
          int *minDistance)

{
  QToolBarAreaLayoutLine *this_00;
  Orientation OVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar7;
  QToolBarAreaLayoutLine *pQVar5;
  long lVar6;
  char cVar8;
  bool bVar9;
  int iVar10;
  Representation RVar11;
  QSize QVar12;
  QSize QVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  
  cVar8 = QRect::contains((QPoint *)&this->rect,SUB81(pos,0));
  if (cVar8 == '\0') {
    iVar10 = distance(this,pos);
    if ((-1 < iVar10) && (iVar10 < *minDistance)) {
      *minDistance = iVar10;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      QList<int>::append(__return_storage_ptr__,(parameter_type)(this->lines).d.size);
      QList<int>::append(__return_storage_ptr__,0);
      return __return_storage_ptr__;
    }
  }
  else {
    uVar4 = (this->rect).x1;
    uVar7 = (this->rect).y1;
    iVar10 = (pos->yp).m_i - uVar7;
    if (this->o == Horizontal) {
      iVar10 = (pos->xp).m_i - uVar4;
    }
    lVar14 = 0;
    for (uVar16 = 0; uVar16 < (ulong)(this->lines).d.size; uVar16 = uVar16 + 1) {
      pQVar5 = (this->lines).d.ptr;
      this_00 = (QToolBarAreaLayoutLine *)((long)&(pQVar5->rect).x1.m_i + lVar14);
      bVar9 = QToolBarAreaLayoutLine::skip(this_00);
      if ((!bVar9) && (cVar8 = QRect::contains((QPoint *)this_00,SUB81(pos,0)), cVar8 != '\0')) {
        lVar17 = 0;
        uVar15 = 0;
        goto LAB_0046ed2e;
      }
      lVar14 = lVar14 + 0x30;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
LAB_0046ed2e:
  if (*(ulong *)((long)&(pQVar5->toolBarItems).d.size + lVar14) <= uVar15) {
LAB_0046edb0:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<int>::append(__return_storage_ptr__,(parameter_type)uVar16);
    QList<int>::append(__return_storage_ptr__,(parameter_type)uVar15);
    *minDistance = 0;
    return __return_storage_ptr__;
  }
  lVar6 = *(long *)((long)&(pQVar5->toolBarItems).d.ptr + lVar14);
  bVar9 = QToolBarAreaLayoutItem::skip((QToolBarAreaLayoutItem *)(lVar6 + lVar17));
  if (!bVar9) {
    OVar1 = this->o;
    QVar12 = QToolBarAreaLayoutItem::sizeHint((QToolBarAreaLayoutItem *)(lVar6 + lVar17));
    QVar13 = (QSize)((ulong)QVar12 >> 0x20);
    if (OVar1 == Horizontal) {
      QVar13 = QVar12;
    }
    iVar2 = *(int *)(lVar6 + 8 + lVar17);
    iVar3 = *(int *)(lVar6 + 0xc + lVar17);
    RVar11.m_i = QVar13.wd.m_i.m_i;
    if (iVar3 < QVar13.wd.m_i.m_i) {
      RVar11.m_i = iVar3;
    }
    if (iVar10 <= RVar11.m_i + iVar2) {
      uVar15 = (ulong)((int)uVar15 + (uint)(RVar11.m_i / 2 + iVar2 < iVar10));
      goto LAB_0046edb0;
    }
  }
  uVar15 = uVar15 + 1;
  lVar17 = lVar17 + 0x18;
  goto LAB_0046ed2e;
}

Assistant:

QList<int> QToolBarAreaLayoutInfo::gapIndex(const QPoint &pos, int *minDistance) const
{
    if (rect.contains(pos)) {
        // <pos> is in QToolBarAreaLayout coordinates.
        // <item.pos> is in local dockarea coordinates (see ~20 lines below)
        // Since we're comparing p with item.pos, we put them in the same coordinate system.
        const int p = pick(o, pos - rect.topLeft());

        for (int j = 0; j < lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = lines.at(j);
            if (line.skip())
                continue;
            if (!line.rect.contains(pos))
                continue;

            int k = 0;
            for (; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip())
                    continue;

                int size = qMin(item.size, pick(o, item.sizeHint()));

                if (p > item.pos + size)
                    continue;
                if (p > item.pos + size/2)
                    ++k;
                break;
            }

            QList<int> result;
            result << j << k;
            *minDistance = 0; //we found a perfect match
            return result;
        }
    } else {
        const int dist = distance(pos);
        //it will only return a path if the minDistance is higher than the current distance
        if (dist >= 0 && *minDistance > dist) {
            *minDistance = dist;

            QList<int> result;
            result << lines.size() << 0;
            return result;
        }
    }

    return QList<int>();
}